

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

aiMesh * __thiscall Assimp::Ogre::SubMesh::ConvertToAssimpMesh(SubMesh *this,Mesh *parent)

{
  Skeleton *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  uint32_t uVar9;
  DeadlyImportError *pDVar10;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar11;
  basic_formatter *pbVar12;
  aiMesh *this_00;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  pointer pVVar16;
  size_t sVar17;
  _Base_ptr p_Var18;
  aiVector3t<float> *paVar19;
  Logger *pLVar20;
  element_type *peVar21;
  undefined4 *puVar22;
  void *pvVar23;
  long lVar24;
  size_type sVar25;
  reference puVar26;
  Bone *this_01;
  mapped_type *boneWeights;
  aiBone *paVar27;
  aiFace *paVar28;
  ulong uVar29;
  size_t local_908;
  _Base_ptr local_900;
  aiVector3t<float> *local_8c0;
  _Base_ptr local_870;
  pointer local_848;
  uint local_82c;
  uint local_828;
  uint local_824;
  size_t local_820;
  size_t local_818;
  size_t local_810;
  MemoryStream *local_808;
  MemoryStream *local_800;
  MemoryStream *local_7f8;
  pointer local_7e0;
  aiFace *local_7b8;
  VertexData *local_770;
  Bone *bone;
  const_iterator rbEnd;
  const_iterator rbIter;
  size_t assimpBoneIndex;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> referencedBones;
  AssimpVertexBoneWeightList weights;
  size_t ogreVertexIndex;
  size_t newIndex;
  size_t v;
  size_t pos;
  aiFace *face;
  size_t ii;
  undefined1 local_688 [6];
  uint16_t iout;
  aiFace ogreFace;
  size_t fsize;
  size_t isize;
  size_t fi;
  MemoryStream *faces;
  aiVector3D *uv2Dest;
  aiVector3D *uv1Dest;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string local_4b0;
  string local_490;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string local_2f8;
  byte local_2d1;
  ulong uStack_2d0;
  bool boneAssignments;
  size_t vWidthUv2;
  size_t vWidthUv1;
  size_t vWidthNormal;
  size_t vWidthPosition;
  size_t sizeUv2;
  size_t sizeUv1;
  size_t sizeNormal;
  size_t sizePosition;
  MemoryStream *uv2;
  MemoryStream *uv1;
  MemoryStream *normals;
  MemoryStream *positions;
  size_t uniqueVertexCount;
  string local_260;
  undefined1 local_23a;
  allocator<char> local_239;
  string local_238;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  VertexElement *local_1f0;
  VertexElement *uv2Element;
  VertexElement *uv1Element;
  VertexElement *normalsElement;
  VertexElement *positionsElement;
  VertexData *src;
  aiMesh *dest;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_38;
  Mesh *local_18;
  Mesh *parent_local;
  SubMesh *this_local;
  
  local_18 = parent;
  parent_local = (Mesh *)this;
  if ((this->super_ISubMesh).operationType != OT_TRIANGLE_LIST) {
    dest._3_1_ = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_1b0);
    pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1b0,
                         (char (*) [63])
                         "Only mesh operation type OT_TRIANGLE_LIST is supported. Found ");
    pbVar12 = (basic_formatter *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<(pbVar11,&(this->super_ISubMesh).operationType);
    Formatter::basic_formatter::operator_cast_to_string(&local_38,pbVar12);
    DeadlyImportError::DeadlyImportError(pDVar10,&local_38);
    dest._3_1_ = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mPrimitiveTypes = 4;
  src = (VertexData *)this_00;
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    aiString::operator=((aiString *)
                        &src[1].super_IVertexData.vertexIndexMapping._M_t._M_impl.field_0x4,
                        &(this->super_ISubMesh).name);
  }
  if ((this->super_ISubMesh).materialIndex != -1) {
    *(int *)&src[1].super_IVertexData.vertexIndexMapping._M_t._M_impl =
         (this->super_ISubMesh).materialIndex;
  }
  if (((this->super_ISubMesh).usesSharedVertexData & 1U) == 0) {
    local_770 = this->vertexData;
  }
  else {
    local_770 = local_18->sharedVertexData;
  }
  positionsElement = (VertexElement *)local_770;
  normalsElement = VertexData::GetVertexElement(local_770,VES_POSITION,0);
  uv1Element = VertexData::GetVertexElement((VertexData *)positionsElement,VES_NORMAL,0);
  uv2Element = VertexData::GetVertexElement
                         ((VertexData *)positionsElement,VES_TEXTURE_COORDINATES,0);
  local_1f0 = VertexData::GetVertexElement((VertexData *)positionsElement,VES_TEXTURE_COORDINATES,1)
  ;
  if (normalsElement == (VertexElement *)0x0) {
    local_212 = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,
               "Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!"
               ,&local_211);
    DeadlyImportError::DeadlyImportError(pDVar10,&local_210);
    local_212 = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (normalsElement->type != VET_FLOAT3) {
    local_23a = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,
               "Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,&local_239);
    DeadlyImportError::DeadlyImportError(pDVar10,&local_238);
    local_23a = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if ((uv1Element != (VertexElement *)0x0) && (uv1Element->type != VET_FLOAT3)) {
    uniqueVertexCount._6_1_ = 1;
    pDVar10 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported."
               ,(allocator<char> *)((long)&uniqueVertexCount + 7));
    DeadlyImportError::DeadlyImportError(pDVar10,&local_260);
    uniqueVertexCount._6_1_ = 0;
    __cxa_throw(pDVar10,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  *(uint32_t *)
   &(src->super_IVertexData).boneAssignments.
    super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
    ._M_impl.super__Vector_impl_data._M_start = this->indexData->faceCount;
  uVar13 = CONCAT44(0,*(uint *)&(src->super_IVertexData).boneAssignments.
                                super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar13;
  uVar14 = SUB168(auVar2 * ZEXT816(0x10),0);
  uVar29 = uVar14 + 8;
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar14) {
    uVar29 = 0xffffffffffffffff;
  }
  puVar15 = (ulong *)operator_new__(uVar29);
  *puVar15 = uVar13;
  paVar28 = (aiFace *)(puVar15 + 1);
  if (uVar13 != 0) {
    local_7b8 = paVar28;
    do {
      aiFace::aiFace(local_7b8);
      local_7b8 = local_7b8 + 1;
    } while (local_7b8 != paVar28 + uVar13);
  }
  src[1].super_IVertexData.boneAssignments.
  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar28;
  uVar8 = *(int *)&(src->super_IVertexData).boneAssignments.
                   super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                   ._M_impl.super__Vector_impl_data._M_start * 3;
  positions = (MemoryStream *)(ulong)uVar8;
  *(uint *)&(src->super_IVertexData).field_0x4 = uVar8;
  uVar13 = CONCAT44(0,*(uint *)&(src->super_IVertexData).field_0x4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar13;
  uVar14 = SUB168(auVar3 * ZEXT816(0xc),0);
  if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  pVVar16 = (pointer)operator_new__(uVar14);
  if (uVar13 != 0) {
    local_7e0 = pVVar16;
    do {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_7e0);
      local_7e0 = local_7e0 + 1;
    } while (local_7e0 != pVVar16 + uVar13);
  }
  (src->super_IVertexData).boneAssignments.
  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVVar16;
  normals = VertexData::VertexBuffer((VertexData *)positionsElement,normalsElement->source);
  if (uv1Element == (VertexElement *)0x0) {
    local_7f8 = (MemoryStream *)0x0;
  }
  else {
    local_7f8 = VertexData::VertexBuffer((VertexData *)positionsElement,uv1Element->source);
  }
  uv1 = local_7f8;
  if (uv2Element == (VertexElement *)0x0) {
    local_800 = (MemoryStream *)0x0;
  }
  else {
    local_800 = VertexData::VertexBuffer((VertexData *)positionsElement,uv2Element->source);
  }
  uv2 = local_800;
  if (local_1f0 == (VertexElement *)0x0) {
    local_808 = (MemoryStream *)0x0;
  }
  else {
    local_808 = VertexData::VertexBuffer((VertexData *)positionsElement,local_1f0->source);
  }
  sizePosition = (size_t)local_808;
  sizeNormal = VertexElement::Size(normalsElement);
  if (uv1Element == (VertexElement *)0x0) {
    local_810 = 0;
  }
  else {
    local_810 = VertexElement::Size(uv1Element);
  }
  sizeUv1 = local_810;
  if (uv2Element == (VertexElement *)0x0) {
    local_818 = 0;
  }
  else {
    local_818 = VertexElement::Size(uv2Element);
  }
  sizeUv2 = local_818;
  if (local_1f0 == (VertexElement *)0x0) {
    local_820 = 0;
  }
  else {
    local_820 = VertexElement::Size(local_1f0);
  }
  vWidthPosition = local_820;
  uVar9 = VertexData::VertexSize((VertexData *)positionsElement,normalsElement->source);
  vWidthNormal = (size_t)uVar9;
  if (uv1Element == (VertexElement *)0x0) {
    local_824 = 0;
  }
  else {
    local_824 = VertexData::VertexSize((VertexData *)positionsElement,uv1Element->source);
  }
  vWidthUv1 = (size_t)local_824;
  if (uv2Element == (VertexElement *)0x0) {
    local_828 = 0;
  }
  else {
    local_828 = VertexData::VertexSize((VertexData *)positionsElement,uv2Element->source);
  }
  vWidthUv2 = (size_t)local_828;
  if (local_1f0 == (VertexElement *)0x0) {
    local_82c = 0;
  }
  else {
    local_82c = VertexData::VertexSize((VertexData *)positionsElement,local_1f0->source);
  }
  uStack_2d0 = (ulong)local_82c;
  local_2d1 = IVertexData::HasBoneAssignments((IVertexData *)positionsElement);
  if (uv1 != (MemoryStream *)0x0) {
    uVar13 = CONCAT44(0,*(uint *)&(src->super_IVertexData).field_0x4);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar13;
    uVar14 = SUB168(auVar4 * ZEXT816(0xc),0);
    if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
      uVar14 = 0xffffffffffffffff;
    }
    pVVar16 = (pointer)operator_new__(uVar14);
    if (uVar13 != 0) {
      local_848 = pVVar16;
      do {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_848);
        local_848 = local_848 + 1;
      } while (local_848 != pVVar16 + uVar13);
    }
    (src->super_IVertexData).boneAssignments.
    super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar16;
  }
  if (uv2 != (MemoryStream *)0x0) {
    if ((uv2Element->type == VET_FLOAT2) || (uv2Element->type == VET_FLOAT3)) {
      sVar17 = VertexElement::ComponentCount(uv2Element);
      *(int *)&(src->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (int)sVar17;
      uVar13 = CONCAT44(0,*(uint *)&(src->super_IVertexData).field_0x4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      uVar14 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      p_Var18 = (_Base_ptr)operator_new__(uVar14);
      if (uVar13 != 0) {
        local_870 = p_Var18;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_870);
          local_870 = (_Base_ptr)((long)&local_870->_M_parent + 4);
        } while (local_870 != (_Base_ptr)(&p_Var18->_M_color + uVar13 * 3));
      }
      (src->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = p_Var18;
    }
    else {
      pLVar20 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_470);
      pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_470,(char (*) [24])"Ogre imported UV0 type ");
      VertexElement::TypeToString_abi_cxx11_(&local_490,uv2Element);
      pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar11,&local_490);
      pbVar12 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar11,(char (*) [45])" is not compatible with Assimp. Ignoring UV.");
      Formatter::basic_formatter::operator_cast_to_string(&local_2f8,pbVar12);
      Logger::warn(pLVar20,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_490);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_470);
      uv2 = (MemoryStream *)0x0;
    }
  }
  if (sizePosition != 0) {
    if ((local_1f0->type == VET_FLOAT2) || (local_1f0->type == VET_FLOAT3)) {
      sVar17 = VertexElement::ComponentCount(local_1f0);
      *(int *)((long)&(src->vertexBindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4
              ) = (int)sVar17;
      uVar13 = CONCAT44(0,*(uint *)&(src->super_IVertexData).field_0x4);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      uVar14 = SUB168(auVar6 * ZEXT816(0xc),0);
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      paVar19 = (aiVector3t<float> *)operator_new__(uVar14);
      if (uVar13 != 0) {
        local_8c0 = paVar19;
        do {
          aiVector3t<float>::aiVector3t(local_8c0);
          local_8c0 = local_8c0 + 1;
        } while (local_8c0 != paVar19 + uVar13);
      }
      (src->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)paVar19;
    }
    else {
      pLVar20 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter(&local_628);
      pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &local_628,(char (*) [24])"Ogre imported UV0 type ");
      VertexElement::TypeToString_abi_cxx11_((string *)&uv1Dest,local_1f0);
      pbVar11 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&uv1Dest);
      pbVar12 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar11,(char (*) [45])" is not compatible with Assimp. Ignoring UV.");
      Formatter::basic_formatter::operator_cast_to_string(&local_4b0,pbVar12);
      Logger::warn(pLVar20,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&uv1Dest);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_628);
      sizePosition = 0;
    }
  }
  if (uv2 == (MemoryStream *)0x0) {
    local_900 = (_Base_ptr)0x0;
  }
  else {
    local_900 = (src->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_right;
  }
  if (sizePosition == 0) {
    local_908 = 0;
  }
  else {
    local_908 = (src->super_IVertexData).boneAssignmentsMap._M_t._M_impl.super__Rb_tree_header.
                _M_node_count;
  }
  peVar21 = std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::get
                      (&(this->indexData->buffer).
                        super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>);
  isize = 0;
  sVar17 = IndexData::IndexSize(this->indexData);
  ogreFace.mIndices = (uint *)IndexData::FaceSize(this->indexData);
  for (; isize < *(uint *)&(src->super_IVertexData).boneAssignments.
                           super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                           ._M_impl.super__Vector_impl_data._M_start; isize = isize + 1) {
    aiFace::aiFace((aiFace *)local_688);
    local_688._0_4_ = 3;
    ogreFace._0_8_ = operator_new__(0xc);
    (*(peVar21->super_IOStream)._vptr_IOStream[4])(peVar21,isize * (long)ogreFace.mIndices,0);
    if ((this->indexData->is32bit & 1U) == 0) {
      ii._6_2_ = 0;
      for (face = (aiFace *)0x0; face < (aiFace *)0x3;
          face = (aiFace *)((long)&face->mNumIndices + 1)) {
        (*(peVar21->super_IOStream)._vptr_IOStream[2])(peVar21,(long)&ii + 6,sVar17,1);
        *(uint *)(ogreFace._0_8_ + (long)face * 4) = (uint)ii._6_2_;
      }
    }
    else {
      (*(peVar21->super_IOStream)._vptr_IOStream[2])(peVar21,ogreFace._0_8_,sVar17,3);
    }
    puVar22 = (undefined4 *)
              ((long)src[1].super_IVertexData.boneAssignments.
                     super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                     ._M_impl.super__Vector_impl_data._M_start + isize * 0x10);
    *puVar22 = 3;
    pvVar23 = operator_new__(0xc);
    *(void **)(puVar22 + 2) = pvVar23;
    for (newIndex = 0; newIndex < 3; newIndex = newIndex + 1) {
      lVar24 = isize * 3 + newIndex;
      ogreVertexIndex._0_4_ = (uint32_t)lVar24;
      *(uint32_t *)(*(long *)(puVar22 + 2) + newIndex * 4) = (uint32_t)ogreVertexIndex;
      uVar8 = *(uint *)(ogreFace._0_8_ + newIndex * 4);
      uVar13 = (ulong)uVar8;
      IVertexData::AddVertexMapping((IVertexData *)positionsElement,uVar8,(uint32_t)ogreVertexIndex)
      ;
      (*(normals->super_IOStream)._vptr_IOStream[4])
                (normals,vWidthNormal * uVar13 + (ulong)normalsElement->offset,0);
      (*(normals->super_IOStream)._vptr_IOStream[2])
                (normals,(src->super_IVertexData).boneAssignments.
                         super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar24,sizeNormal,1);
      if (uv1 != (MemoryStream *)0x0) {
        (*(uv1->super_IOStream)._vptr_IOStream[4])
                  (uv1,vWidthUv1 * uVar13 + (ulong)uv1Element->offset,0);
        (*(uv1->super_IOStream)._vptr_IOStream[2])
                  (uv1,(src->super_IVertexData).boneAssignments.
                       super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar24,sizeUv1,1);
      }
      if ((uv2 != (MemoryStream *)0x0) && (local_900 != (_Base_ptr)0x0)) {
        (*(uv2->super_IOStream)._vptr_IOStream[4])
                  (uv2,vWidthUv2 * uVar13 + (ulong)uv2Element->offset,0);
        (*(uv2->super_IOStream)._vptr_IOStream[2])(uv2,(long)local_900 + lVar24 * 0xc,sizeUv2,1);
        *(float *)((long)local_900 + lVar24 * 0xc + 4) =
             1.0 - *(float *)((long)local_900 + lVar24 * 0xc + 4);
      }
      if ((sizePosition != 0) && (local_908 != 0)) {
        (**(code **)(*(long *)sizePosition + 0x20))
                  (sizePosition,uStack_2d0 * uVar13 + (ulong)local_1f0->offset,0);
        (**(code **)(*(long *)sizePosition + 0x10))
                  (sizePosition,local_908 + lVar24 * 0xc,vWidthPosition,1);
        *(float *)(local_908 + lVar24 * 0xc + 4) = 1.0 - *(float *)(local_908 + lVar24 * 0xc + 4);
      }
    }
    aiFace::~aiFace((aiFace *)local_688);
  }
  if ((local_18->skeleton != (Skeleton *)0x0) && ((local_2d1 & 1) != 0)) {
    IVertexData::AssimpBoneWeights
              ((AssimpVertexBoneWeightList *)
               &referencedBones._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IVertexData *)positionsElement,(ulong)*(uint *)&(src->super_IVertexData).field_0x4);
    IVertexData::ReferencedBonesByWeights
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               &assimpBoneIndex,(IVertexData *)positionsElement);
    sVar25 = std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
             size((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *
                  )&assimpBoneIndex);
    *(int *)&src[1].super_IVertexData.boneAssignments.
             super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
             ._M_impl.super__Vector_impl_data._M_finish = (int)sVar25;
    pVVar16 = (pointer)operator_new__((ulong)*(uint *)&src[1].super_IVertexData.boneAssignments.
                                                                                                              
                                                  super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish << 3);
    src[1].super_IVertexData.boneAssignments.
    super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar16;
    rbIter._M_node = (_Base_ptr)0x0;
    rbEnd._M_node =
         (_Base_ptr)
         std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::begin
                   ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)&assimpBoneIndex);
    bone = (Bone *)std::
                   set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::
                   end((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                        *)&assimpBoneIndex);
    while (bVar7 = std::operator!=(&rbEnd,(_Self *)&bone), bVar7) {
      pSVar1 = local_18->skeleton;
      puVar26 = std::_Rb_tree_const_iterator<unsigned_short>::operator*(&rbEnd);
      this_01 = Skeleton::BoneById(pSVar1,*puVar26);
      pSVar1 = local_18->skeleton;
      boneWeights = std::
                    map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                    ::operator[]((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                  *)&referencedBones._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count,&this_01->id);
      paVar27 = Bone::ConvertToAssimpBone(this_01,pSVar1,boneWeights);
      *(aiBone **)
       (&(src[1].super_IVertexData.boneAssignments.
          super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->vertexIndex +
       (long)rbIter._M_node * 2) = paVar27;
      std::_Rb_tree_const_iterator<unsigned_short>::operator++(&rbEnd);
      rbIter._M_node = (_Base_ptr)((long)&(rbIter._M_node)->_M_color + 1);
    }
    std::set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>::~set
              ((set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
               &assimpBoneIndex);
    std::
    map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
    ::~map((map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
            *)&referencedBones._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return (aiMesh *)src;
}

Assistant:

aiMesh *SubMesh::ConvertToAssimpMesh(Mesh *parent)
{
    if (operationType != OT_TRIANGLE_LIST) {
        throw DeadlyImportError(Formatter::format() << "Only mesh operation type OT_TRIANGLE_LIST is supported. Found " << operationType);
    }

    aiMesh *dest = new aiMesh();
    dest->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    if (!name.empty())
        dest->mName = name;

    // Material index
    if (materialIndex != -1)
        dest->mMaterialIndex = materialIndex;

    // Pick source vertex data from shader geometry or from internal geometry.
    VertexData *src = (!usesSharedVertexData ? vertexData : parent->sharedVertexData);

    VertexElement *positionsElement = src->GetVertexElement(VertexElement::VES_POSITION);
    VertexElement *normalsElement   = src->GetVertexElement(VertexElement::VES_NORMAL);
    VertexElement *uv1Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 0);
    VertexElement *uv2Element       = src->GetVertexElement(VertexElement::VES_TEXTURE_COORDINATES, 1);

    // Sanity checks
    if (!positionsElement) {
        throw DeadlyImportError("Failed to import Ogre VertexElement::VES_POSITION. Mesh does not have vertex positions!");
    } else if (positionsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh position vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    } else if (normalsElement && normalsElement->type != VertexElement::VET_FLOAT3) {
        throw DeadlyImportError("Ogre Mesh normal vertex element type != VertexElement::VET_FLOAT3. This is not supported.");
    }

    // Faces
    dest->mNumFaces = indexData->faceCount;
    dest->mFaces = new aiFace[dest->mNumFaces];

    // Assimp required unique vertices, we need to convert from Ogres shared indexing.
    size_t uniqueVertexCount = dest->mNumFaces * 3;
    dest->mNumVertices = static_cast<unsigned int>(uniqueVertexCount);
    dest->mVertices = new aiVector3D[dest->mNumVertices];

    // Source streams
    MemoryStream *positions      = src->VertexBuffer(positionsElement->source);
    MemoryStream *normals        = (normalsElement ? src->VertexBuffer(normalsElement->source) : 0);
    MemoryStream *uv1            = (uv1Element ? src->VertexBuffer(uv1Element->source) : 0);
    MemoryStream *uv2            = (uv2Element ? src->VertexBuffer(uv2Element->source) : 0);

    // Element size
    const size_t sizePosition    = positionsElement->Size();
    const size_t sizeNormal      = (normalsElement ? normalsElement->Size() : 0);
    const size_t sizeUv1         = (uv1Element ? uv1Element->Size() : 0);
    const size_t sizeUv2         = (uv2Element ? uv2Element->Size() : 0);

    // Vertex width
    const size_t vWidthPosition  = src->VertexSize(positionsElement->source);
    const size_t vWidthNormal    = (normalsElement ? src->VertexSize(normalsElement->source) : 0);
    const size_t vWidthUv1       = (uv1Element ? src->VertexSize(uv1Element->source) : 0);
    const size_t vWidthUv2       = (uv2Element ? src->VertexSize(uv2Element->source) : 0);

    bool boneAssignments = src->HasBoneAssignments();

    // Prepare normals
    if (normals)
        dest->mNormals = new aiVector3D[dest->mNumVertices];

    // Prepare UVs, ignoring incompatible UVs.
    if (uv1)
    {
        if (uv1Element->type == VertexElement::VET_FLOAT2 || uv1Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[0] = static_cast<unsigned int>(uv1Element->ComponentCount());
            dest->mTextureCoords[0] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv1Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv1 = 0;
        }
    }
    if (uv2)
    {
        if (uv2Element->type == VertexElement::VET_FLOAT2 || uv2Element->type == VertexElement::VET_FLOAT3)
        {
            dest->mNumUVComponents[1] = static_cast<unsigned int>(uv2Element->ComponentCount());
            dest->mTextureCoords[1] = new aiVector3D[dest->mNumVertices];
        }
        else
        {
            ASSIMP_LOG_WARN(Formatter::format() << "Ogre imported UV0 type " << uv2Element->TypeToString() << " is not compatible with Assimp. Ignoring UV.");
            uv2 = 0;
        }
    }

    aiVector3D *uv1Dest = (uv1 ? dest->mTextureCoords[0] : 0);
    aiVector3D *uv2Dest = (uv2 ? dest->mTextureCoords[1] : 0);

    MemoryStream *faces = indexData->buffer.get();
    for (size_t fi=0, isize=indexData->IndexSize(), fsize=indexData->FaceSize();
         fi<dest->mNumFaces; ++fi)
    {
        // Source Ogre face
        aiFace ogreFace;
        ogreFace.mNumIndices = 3;
        ogreFace.mIndices = new unsigned int[3];

        faces->Seek(fi * fsize, aiOrigin_SET);
        if (indexData->is32bit)
        {
            faces->Read(&ogreFace.mIndices[0], isize, 3);
        }
        else
        {
            uint16_t iout = 0;
            for (size_t ii=0; ii<3; ++ii)
            {
                faces->Read(&iout, isize, 1);
                ogreFace.mIndices[ii] = static_cast<unsigned int>(iout);
            }
        }

        // Destination Assimp face
        aiFace &face = dest->mFaces[fi];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        const size_t pos = fi * 3;
        for (size_t v=0; v<3; ++v)
        {
            const size_t newIndex = pos + v;

            // Write face index
            face.mIndices[v] = static_cast<unsigned int>(newIndex);

            // Ogres vertex index to ref into the source buffers.
            const size_t ogreVertexIndex = ogreFace.mIndices[v];
            src->AddVertexMapping(static_cast<uint32_t>(ogreVertexIndex), static_cast<uint32_t>(newIndex));

            // Position
            positions->Seek((vWidthPosition * ogreVertexIndex) + positionsElement->offset, aiOrigin_SET);
            positions->Read(&dest->mVertices[newIndex], sizePosition, 1);

            // Normal
            if (normals)
            {
                normals->Seek((vWidthNormal * ogreVertexIndex) + normalsElement->offset, aiOrigin_SET);
                normals->Read(&dest->mNormals[newIndex], sizeNormal, 1);
            }
            // UV0
            if (uv1 && uv1Dest)
            {
                uv1->Seek((vWidthUv1 * ogreVertexIndex) + uv1Element->offset, aiOrigin_SET);
                uv1->Read(&uv1Dest[newIndex], sizeUv1, 1);
                uv1Dest[newIndex].y = (uv1Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
            // UV1
            if (uv2 && uv2Dest)
            {
                uv2->Seek((vWidthUv2 * ogreVertexIndex) + uv2Element->offset, aiOrigin_SET);
                uv2->Read(&uv2Dest[newIndex], sizeUv2, 1);
                uv2Dest[newIndex].y = (uv2Dest[newIndex].y * -1) + 1; // Flip UV from Ogre to Assimp form
            }
        }
    }

    // Bones and bone weights
    if (parent->skeleton && boneAssignments)
    {
        AssimpVertexBoneWeightList weights = src->AssimpBoneWeights(dest->mNumVertices);
        std::set<uint16_t> referencedBones = src->ReferencedBonesByWeights();

        dest->mNumBones = static_cast<unsigned int>(referencedBones.size());
        dest->mBones = new aiBone*[dest->mNumBones];

        size_t assimpBoneIndex = 0;
        for(std::set<uint16_t>::const_iterator rbIter=referencedBones.begin(), rbEnd=referencedBones.end(); rbIter != rbEnd; ++rbIter, ++assimpBoneIndex)
        {
            Bone *bone = parent->skeleton->BoneById((*rbIter));
            dest->mBones[assimpBoneIndex] = bone->ConvertToAssimpBone(parent->skeleton, weights[bone->id]);
        }
    }

    return dest;
}